

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetWindowPos(ImGuiWindow *window,ImVec2 *pos,ImGuiCond cond)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImVec2 IVar7;
  float fVar8;
  float fVar9;
  
  if ((cond == 0) || (((char)*(uint *)&window->field_0xbc & cond) != 0)) {
    *(uint *)&window->field_0xbc = *(uint *)&window->field_0xbc & 0xfffffff1;
    (window->SetWindowPosVal).x = 3.4028235e+38;
    (window->SetWindowPosVal).y = 3.4028235e+38;
    IVar1 = window->Pos;
    fVar8 = (float)(int)(*pos).x;
    fVar9 = (float)(int)(*pos).y;
    IVar3.y = fVar9;
    IVar3.x = fVar8;
    window->Pos = IVar3;
    fVar8 = fVar8 - IVar1.x;
    fVar9 = fVar9 - IVar1.y;
    if ((fVar8 != 0.0) || (((NAN(fVar8) || (fVar9 != 0.0)) || (NAN(fVar9))))) {
      MarkIniSettingsDirty(window);
      IVar1 = (window->DC).CursorPos;
      IVar7.x = IVar1.x + fVar8;
      IVar7.y = IVar1.y + fVar9;
      (window->DC).CursorPos = IVar7;
      IVar1 = (window->DC).IdealMaxPos;
      IVar2.y = IVar1.y + fVar9;
      IVar2.x = IVar1.x + fVar8;
      (window->DC).IdealMaxPos = IVar2;
      fVar4 = (window->DC).CursorStartPos.y;
      fVar5 = (window->DC).CursorMaxPos.x;
      fVar6 = (window->DC).CursorMaxPos.y;
      (window->DC).CursorStartPos.x = (window->DC).CursorStartPos.x + fVar8;
      (window->DC).CursorStartPos.y = fVar4 + fVar9;
      (window->DC).CursorMaxPos.x = fVar5 + fVar8;
      (window->DC).CursorMaxPos.y = fVar6 + fVar9;
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowPos(ImGuiWindow* window, const ImVec2& pos, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowPosAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowPosAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);
    window->SetWindowPosVal = ImVec2(FLT_MAX, FLT_MAX);

    // Set
    const ImVec2 old_pos = window->Pos;
    window->Pos = ImFloor(pos);
    ImVec2 offset = window->Pos - old_pos;
    if (offset.x == 0.0f && offset.y == 0.0f)
        return;
    MarkIniSettingsDirty(window);
    window->DC.CursorPos += offset;         // As we happen to move the window while it is being appended to (which is a bad idea - will smear) let's at least offset the cursor
    window->DC.CursorMaxPos += offset;      // And more importantly we need to offset CursorMaxPos/CursorStartPos this so ContentSize calculation doesn't get affected.
    window->DC.IdealMaxPos += offset;
    window->DC.CursorStartPos += offset;
}